

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcAbs.c
# Opt level: O1

int Wla_ManCheckCombUnsat(Wla_Man_t *pWla,Aig_Man_t *pAig)

{
  uint uVar1;
  Pdr_Par_t *pPars;
  int iVar2;
  int iVar3;
  Aig_Man_t *p;
  char *pcVar4;
  Pdr_Man_t *p_00;
  long lVar5;
  long lVar6;
  timespec ts_1;
  Ssw_Pars_t ScorrPars;
  timespec local_e8;
  Ssw_Pars_t local_d8;
  
  pPars = (Pdr_Par_t *)pWla->pPdrPars;
  if (20000 < pAig->nObjs[5]) goto LAB_00888b0a;
  iVar2 = clock_gettime(3,(timespec *)&local_d8);
  if (iVar2 < 0) {
    lVar5 = 1;
  }
  else {
    lVar5 = SUB168(SEXT816(-0x20c49ba5e353f7cf) *
                   SEXT816(CONCAT44(local_d8.nFramesAddSim,local_d8.nFramesK)),8);
    lVar5 = ((lVar5 >> 7) - (lVar5 >> 0x3f)) + local_d8._0_8_ * -1000000;
  }
  Ssw_ManSetDefaultParams(&local_d8);
  local_d8.fStopWhenGone = 1;
  local_d8.nFramesK = 1;
  p = Ssw_SignalCorrespondence(pAig,&local_d8);
  if (p == (Aig_Man_t *)0x0) {
    __assert_fail("pAigScorr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcAbs.c"
                  ,0x5ad,"int Wla_ManCheckCombUnsat(Wla_Man_t *, Aig_Man_t *)");
  }
  uVar1 = p->nObjs[5];
  Aig_ManStop(p);
  iVar2 = pWla->pPars->fVerbose;
  if (uVar1 == 0) {
    if (iVar2 != 0) {
      iVar3 = 3;
      iVar2 = clock_gettime(3,&local_e8);
      if (iVar2 < 0) {
        lVar6 = -1;
      }
      else {
        lVar6 = local_e8.tv_nsec / 1000 + local_e8.tv_sec * 1000000;
      }
      pcVar4 = "SCORR proved UNSAT. Time";
      goto LAB_00888ad3;
    }
  }
  else if (iVar2 != 0) {
    Abc_Print((int)p,"SCORR failed with %d ANDs. ",(ulong)uVar1);
    iVar3 = 3;
    iVar2 = clock_gettime(3,&local_e8);
    if (iVar2 < 0) {
      lVar6 = -1;
    }
    else {
      lVar6 = local_e8.tv_nsec / 1000 + local_e8.tv_sec * 1000000;
    }
    pcVar4 = "Time";
LAB_00888ad3:
    Abc_Print(iVar3,"%s =",pcVar4);
    Abc_Print(iVar3,"%9.2f sec\n",(double)(lVar5 + lVar6) / 1000000.0);
  }
  if (uVar1 == 0) {
    return 1;
  }
LAB_00888b0a:
  iVar2 = clock_gettime(3,(timespec *)&local_d8);
  if (iVar2 < 0) {
    lVar5 = 1;
  }
  else {
    lVar5 = SUB168(SEXT816(-0x20c49ba5e353f7cf) *
                   SEXT816(CONCAT44(local_d8.nFramesAddSim,local_d8.nFramesK)),8);
    lVar5 = ((lVar5 >> 7) - (lVar5 >> 0x3f)) + local_d8._0_8_ * -1000000;
  }
  pPars->fVerbose = 0;
  p_00 = Pdr_ManStart(pAig,pPars,(Vec_Int_t *)0x0);
  iVar2 = IPdr_ManCheckCombUnsat(p_00);
  Pdr_ManStop(p_00);
  pPars->fVerbose = pWla->pPars->fPdrVerbose;
  iVar3 = clock_gettime(3,(timespec *)&local_d8);
  if (iVar3 < 0) {
    lVar6 = -1;
  }
  else {
    lVar6 = CONCAT44(local_d8.nFramesAddSim,local_d8.nFramesK) / 1000 + local_d8._0_8_ * 1000000;
  }
  pWla->tPdr = pWla->tPdr + lVar6 + lVar5;
  return iVar2;
}

Assistant:

int Wla_ManCheckCombUnsat( Wla_Man_t * pWla, Aig_Man_t * pAig )
{
    Pdr_Man_t * pPdr;
    Pdr_Par_t * pPdrPars = (Pdr_Par_t *)pWla->pPdrPars;
    abctime clk;
    int RetValue = -1;

    if ( Aig_ManAndNum( pAig ) <= 20000 )
    { 
        Aig_Man_t * pAigScorr;
        Ssw_Pars_t ScorrPars, * pScorrPars = &ScorrPars;
        int nAnds;

        clk = Abc_Clock();

        Ssw_ManSetDefaultParams( pScorrPars );
        pScorrPars->fStopWhenGone = 1;
        pScorrPars->nFramesK = 1;
        pAigScorr = Ssw_SignalCorrespondence( pAig, pScorrPars );
        assert ( pAigScorr );
        nAnds = Aig_ManAndNum( pAigScorr); 
        Aig_ManStop( pAigScorr );

        if ( nAnds == 0 )
        {
            if ( pWla->pPars->fVerbose )
                Abc_PrintTime( 1, "SCORR proved UNSAT. Time", Abc_Clock() - clk );
            return 1;
        }
        else if ( pWla->pPars->fVerbose )
        {
            Abc_Print( 1, "SCORR failed with %d ANDs. ", nAnds);
            Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
        }
    }

    clk = Abc_Clock();

    pPdrPars->fVerbose = 0;
    pPdr = Pdr_ManStart( pAig, pPdrPars, NULL );
    RetValue = IPdr_ManCheckCombUnsat( pPdr );
    Pdr_ManStop( pPdr );
    pPdrPars->fVerbose = pWla->pPars->fPdrVerbose;

    pWla->tPdr += Abc_Clock() - clk;

    return RetValue;
}